

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeString::extractBetween
          (UnicodeString *this,int32_t start,int32_t limit,UnicodeString *target)

{
  short sVar1;
  int32_t length;
  int iVar2;
  int iVar3;
  int srcStart;
  
  srcStart = 0;
  if (-1 < start) {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    srcStart = start;
    if (iVar3 < start) {
      srcStart = iVar3;
    }
  }
  iVar3 = 0;
  if (-1 < limit) {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    iVar3 = limit;
    if (iVar2 < limit) {
      iVar3 = iVar2;
    }
  }
  sVar1 = (target->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (target->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  doReplace(target,0,length,this,srcStart,iVar3 - srcStart);
  return;
}

Assistant:

void 
UnicodeString::extractBetween(int32_t start,
                  int32_t limit,
                  UnicodeString& target) const {
  pinIndex(start);
  pinIndex(limit);
  doExtract(start, limit - start, target);
}